

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializeGameBoard.cpp
# Opt level: O3

list<Player,_std::allocator<Player>_> * initializeGameBoard_abi_cxx11_(void)

{
  int iVar1;
  _Node *p_Var2;
  long *plVar3;
  int playernum;
  list<Player,std::allocator<Player>> *in_RDI;
  GameBoard board;
  _List_base<Player,_std::allocator<Player>_> local_200;
  Player local_1e8;
  
  iVar1 = rand();
  playernum = iVar1 % 7 + 2;
  *(list<Player,std::allocator<Player>> **)(in_RDI + 8) = in_RDI;
  *(list<Player,std::allocator<Player>> **)in_RDI = in_RDI;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  if (-2 < iVar1 % 7) {
    iVar1 = playernum;
    do {
      Player::Player(&local_1e8,0x28,0x3c);
      p_Var2 = std::__cxx11::list<Player,std::allocator<Player>>::_M_create_node<Player_const&>
                         (in_RDI,&local_1e8);
      std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      Player::~Player(&local_1e8);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  std::__cxx11::list<Player,_std::allocator<Player>_>::list
            ((list<Player,_std::allocator<Player>_> *)&local_200,
             (list<Player,_std::allocator<Player>_> *)in_RDI);
  GameBoard::GameBoard
            ((GameBoard *)&local_1e8,playernum,0x28,0x3c,
             (list<Player,_std::allocator<Player>_> *)&local_200);
  std::__cxx11::_List_base<Player,_std::allocator<Player>_>::_M_clear(&local_200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting game!",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  GameBoard::printGameStatistics((GameBoard *)&local_1e8);
  GameBoard::~GameBoard((GameBoard *)&local_1e8);
  return (list<Player,_std::allocator<Player>_> *)in_RDI;
}

Assistant:

list<Player> initializeGameBoard()                                           //initializes players and their number, min and max number of cards for each player(same)
{
    int playernum = rand()%7 + 2;                                            //random num from [2, 8]
    int min = 40;                                                            //default limits
    int max = 60;

    list<Player> myplayers;
    int i;

    for (i=0; i<playernum; i++)                                              //create playernum players
    {
        //passes limits for decks and creates them in player constructor
        Player play(min, max);
        myplayers.push_back(play);
    }

    GameBoard board(playernum, min, max, myplayers);                         //create board
    cout << "Starting game!"<<endl<<endl;
    board.printGameStatistics();                                             //print stats

    return myplayers;
}